

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

float_t __thiscall djb::microfacet::sigma(microfacet *this,vec3 *wi,args *args)

{
  float extraout_XMM0_Da;
  vec3 vVar1;
  
  vVar1 = djb::operator*(&args->minv,wi);
  (*(this->super_brdf)._vptr_brdf[10])(this);
  return extraout_XMM0_Da * SQRT(vVar1.z * vVar1.z + vVar1.x * vVar1.x + vVar1.y * vVar1.y);
}

Assistant:

float_t microfacet::sigma(const vec3 &wi, const args &args) const
{
	vec3 wi_std = args.minv * wi;
	float_t nrm = sqrt(dot(wi_std, wi_std));
	return sigma_std(wi_std / nrm) * nrm;
}